

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_area.h
# Opt level: O1

void __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex corner_id,int *prediction)

{
  ulong uVar1;
  uint uVar2;
  int i;
  long lVar3;
  uint uVar4;
  CornerIndex ci;
  ulong uVar5;
  CornerIndex ci_00;
  ulong uVar6;
  long lVar7;
  long lVar8;
  VectorD<long,_3> normal;
  VectorD<long,_3> pos_next;
  VertexCornersIterator<draco::CornerTable> cit;
  VectorD<long,_3> delta_prev;
  VectorD<long,_3> delta_next;
  VectorD<long,_3> pos_cent;
  VectorD<long,_3> pos_prev;
  ulong local_108;
  long lStack_100;
  long local_f8;
  VectorD<long,_3> local_e8;
  uint local_c4;
  VertexCornersIterator<draco::CornerTable> local_c0;
  long local_a8 [4];
  long local_88 [4];
  int *local_68;
  VectorD<long,_3> local_60;
  VectorD<long,_3> local_48;
  
  local_c0.corner_table_ =
       (this->
       super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
       ).mesh_data_.corner_table_;
  local_c0.left_traversal_ = true;
  local_c0.start_corner_.value_ = corner_id.value_;
  local_c0.corner_.value_ = corner_id.value_;
  local_68 = prediction;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ::GetPositionForCorner
            (&local_60,
             &this->
              super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ,corner_id);
  local_108 = 0;
  lStack_100 = 0;
  local_f8 = 0;
  uVar5 = 0;
  if (local_c0.corner_.value_ != 0xffffffff) {
    uVar4 = corner_id.value_ + 1;
    uVar2 = ((corner_id.value_ * -0x55555555 < 0x55555556) - 1 | 2) + corner_id.value_;
    if (uVar4 == 0) {
      uVar2 = 0xffffffff;
    }
    local_c4 = corner_id.value_ - 2;
    if (0x55555555 < uVar4 * -0x55555555) {
      local_c4 = uVar4;
    }
    lVar7 = 0;
    lVar8 = 0;
    if (corner_id.value_ == 0xffffffff) {
      local_c4 = 0xffffffff;
    }
    do {
      ci.value_ = local_c4;
      ci_00.value_ = uVar2;
      if ((this->
          super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
          ).normal_prediction_mode_ != ONE_TRIANGLE) {
        ci.value_ = local_c0.corner_.value_ - 2;
        if (0x55555555 < local_c0.corner_.value_ * -0x55555555 + 0xaaaaaaab) {
          ci.value_ = local_c0.corner_.value_ + 1;
        }
        ci_00.value_ = ((local_c0.corner_.value_ * -0x55555555 < 0x55555556) - 1 | 2) +
                       local_c0.corner_.value_;
      }
      MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
      ::GetPositionForCorner
                (&local_e8,
                 &this->
                  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                 ,ci);
      MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
      ::GetPositionForCorner
                (&local_48,
                 &this->
                  super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                 ,ci_00);
      local_88[0] = 0;
      local_88[1] = 0;
      local_88[2] = 0;
      lVar3 = 0;
      do {
        local_88[lVar3] = local_e8.v_._M_elems[lVar3] - local_60.v_._M_elems[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      local_a8[0] = 0;
      local_a8[1] = 0;
      local_a8[2] = 0;
      lVar3 = 0;
      do {
        local_a8[lVar3] = local_48.v_._M_elems[lVar3] - local_60.v_._M_elems[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      uVar5 = uVar5 + (local_a8[2] * local_88[1] - local_a8[1] * local_88[2]);
      lVar7 = lVar7 + (local_88[2] * local_a8[0] - local_a8[2] * local_88[0]);
      lVar8 = lVar8 + (local_88[0] * local_a8[1] - local_a8[0] * local_88[1]);
      VertexCornersIterator<draco::CornerTable>::Next(&local_c0);
    } while (local_c0.corner_.value_ != 0xffffffff);
    lStack_100 = lVar7;
    local_f8 = lVar8;
  }
  local_108 = uVar5;
  if ((this->
      super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
      ).normal_prediction_mode_ == ONE_TRIANGLE) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      uVar1 = (&local_108)[lVar7];
      uVar6 = -uVar1;
      if (0 < (long)uVar1) {
        uVar6 = uVar1;
      }
      if ((uVar6 ^ 0x7fffffffffffffff) < uVar5) {
        uVar5 = 0x7fffffffffffffff;
        break;
      }
      uVar5 = uVar5 + uVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if ((long)(int)uVar5 < 0x20000001) goto LAB_0016a6a9;
    local_e8.v_._M_elems[0] = 0;
    local_e8.v_._M_elems[1] = 0;
    local_e8.v_._M_elems[2] = 0;
    lVar7 = 0;
    do {
      local_e8.v_._M_elems[lVar7] =
           (long)(&local_108)[lVar7] / (long)((ulong)(long)(int)uVar5 >> 0x1d);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  else {
    lVar7 = 0;
    uVar5 = 0;
    do {
      uVar1 = (&local_108)[lVar7];
      uVar6 = -uVar1;
      if (0 < (long)uVar1) {
        uVar6 = uVar1;
      }
      if ((uVar6 ^ 0x7fffffffffffffff) < uVar5) {
        uVar5 = 0x7fffffffffffffff;
        break;
      }
      uVar5 = uVar5 + uVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if ((long)uVar5 < 0x20000001) goto LAB_0016a6a9;
    local_e8.v_._M_elems[0] = 0;
    local_e8.v_._M_elems[1] = 0;
    local_e8.v_._M_elems[2] = 0;
    lVar7 = 0;
    do {
      local_e8.v_._M_elems[lVar7] = (long)(&local_108)[lVar7] / (long)(uVar5 >> 0x1d);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  local_f8._0_4_ = (int)local_e8.v_._M_elems[2];
  local_108 = local_e8.v_._M_elems[0];
  lStack_100._0_4_ = (undefined4)local_e8.v_._M_elems[1];
LAB_0016a6a9:
  *(ulong *)local_68 = CONCAT44((undefined4)lStack_100,(undefined4)local_108);
  local_68[2] = (int)local_f8;
  return;
}

Assistant:

void ComputePredictedValue(CornerIndex corner_id,
                             DataTypeT *prediction) override {
    DRACO_DCHECK(this->IsInitialized());
    typedef typename MeshDataT::CornerTable CornerTable;
    const CornerTable *const corner_table = this->mesh_data_.corner_table();
    // Going to compute the predicted normal from the surrounding triangles
    // according to the connectivity of the given corner table.
    VertexCornersIterator<CornerTable> cit(corner_table, corner_id);
    // Position of central vertex does not change in loop.
    const VectorD<int64_t, 3> pos_cent = this->GetPositionForCorner(corner_id);
    // Computing normals for triangles and adding them up.

    VectorD<int64_t, 3> normal;
    CornerIndex c_next, c_prev;
    while (!cit.End()) {
      // Getting corners.
      if (this->normal_prediction_mode_ == ONE_TRIANGLE) {
        c_next = corner_table->Next(corner_id);
        c_prev = corner_table->Previous(corner_id);
      } else {
        c_next = corner_table->Next(cit.Corner());
        c_prev = corner_table->Previous(cit.Corner());
      }
      const VectorD<int64_t, 3> pos_next = this->GetPositionForCorner(c_next);
      const VectorD<int64_t, 3> pos_prev = this->GetPositionForCorner(c_prev);

      // Computing delta vectors to next and prev.
      const VectorD<int64_t, 3> delta_next = pos_next - pos_cent;
      const VectorD<int64_t, 3> delta_prev = pos_prev - pos_cent;

      // Computing cross product.
      const VectorD<int64_t, 3> cross = CrossProduct(delta_next, delta_prev);

      // Prevent signed integer overflows by doing math as unsigned.
      auto normal_data = reinterpret_cast<uint64_t *>(normal.data());
      auto cross_data = reinterpret_cast<const uint64_t *>(cross.data());
      normal_data[0] = normal_data[0] + cross_data[0];
      normal_data[1] = normal_data[1] + cross_data[1];
      normal_data[2] = normal_data[2] + cross_data[2];

      cit.Next();
    }

    // Convert to int32_t, make sure entries are not too large.
    constexpr int64_t upper_bound = 1 << 29;
    if (this->normal_prediction_mode_ == ONE_TRIANGLE) {
      const int32_t abs_sum = static_cast<int32_t>(normal.AbsSum());
      if (abs_sum > upper_bound) {
        const int64_t quotient = abs_sum / upper_bound;
        normal = normal / quotient;
      }
    } else {
      const int64_t abs_sum = normal.AbsSum();
      if (abs_sum > upper_bound) {
        const int64_t quotient = abs_sum / upper_bound;
        normal = normal / quotient;
      }
    }
    DRACO_DCHECK_LE(normal.AbsSum(), upper_bound);
    prediction[0] = static_cast<int32_t>(normal[0]);
    prediction[1] = static_cast<int32_t>(normal[1]);
    prediction[2] = static_cast<int32_t>(normal[2]);
  }